

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delta_encoder.c
# Opt level: O0

lzma_ret lzma_delta_props_encode(void *options,uint8_t *out)

{
  uint64_t uVar1;
  lzma_options_delta *opt;
  uint8_t *out_local;
  void *options_local;
  
  uVar1 = lzma_delta_coder_memusage(options);
  if (uVar1 == 0xffffffffffffffff) {
    options_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    *out = (char)*(undefined4 *)((long)options + 4) + 0xff;
    options_local._4_4_ = LZMA_OK;
  }
  return options_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_delta_props_encode(const void *options, uint8_t *out)
{
	// The caller must have already validated the options, so it's
	// LZMA_PROG_ERROR if they are invalid.
	if (lzma_delta_coder_memusage(options) == UINT64_MAX)
		return LZMA_PROG_ERROR;

	const lzma_options_delta *opt = options;
	out[0] = opt->dist - LZMA_DELTA_DIST_MIN;

	return LZMA_OK;
}